

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O2

void Gia_Iso3Test(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vSign_00;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  void *__s;
  int *piVar5;
  int *piVar6;
  abctime aVar7;
  int c;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  size_t __size;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint local_70;
  Vec_Int_t *vSign;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  void *local_40;
  abctime local_38;
  
  local_38 = Abc_Clock();
  vSign = (Vec_Int_t *)0x0;
  Gia_Iso3Init(p);
  uVar10 = 0xffffffffffffffff;
  for (uVar11 = 0; uVar11 != 500; uVar11 = uVar11 + 1) {
    local_54 = (uint)uVar10;
    uVar8 = p->nObjs;
    local_50 = uVar11;
    vSign_00 = (Vec_Int_t *)malloc(0x10);
    uVar10 = (ulong)uVar8;
    if (uVar8 - 1 < 0xf) {
      uVar10 = 0x10;
    }
    vSign_00->nSize = 0;
    iVar1 = (int)uVar10;
    vSign_00->nCap = iVar1;
    if (iVar1 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)iVar1 << 2);
    }
    vSign_00->pArray = piVar3;
    uVar13 = 0;
    while (((int)uVar13 < (int)uVar8 &&
           (pGVar4 = Gia_ManObj(p,(int)uVar13), pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar11 = pGVar4->Value;
      iVar1 = (int)uVar10;
      if (uVar13 == uVar10) {
        uVar12 = (ulong)(uint)(iVar1 * 2);
        if (iVar1 < 0x10) {
          uVar12 = 0x10;
        }
        if (iVar1 < (int)uVar12) {
          if (piVar3 == (int *)0x0) {
            piVar3 = (int *)malloc(uVar12 << 2);
          }
          else {
            piVar3 = (int *)realloc(piVar3,uVar12 << 2);
          }
          vSign_00->pArray = piVar3;
          if (piVar3 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vSign_00->nCap = (int)uVar12;
          uVar10 = uVar12;
        }
      }
      vSign_00->nSize = (int)(uVar13 + 1);
      piVar3[uVar13] = uVar11;
      uVar8 = p->nObjs;
      uVar13 = uVar13 + 1;
    }
    uVar11 = vSign_00->nSize;
    uVar8 = uVar11;
    if (1 < uVar11) {
      uVar8 = 0;
      for (uVar2 = uVar11 - 1; uVar2 != 0; uVar2 = uVar2 >> 1) {
        uVar8 = uVar8 + 1;
      }
    }
    iVar1 = 1 << ((byte)uVar8 & 0x1f);
    local_4c = iVar1 - 1;
    __size = (long)iVar1 << 2;
    vSign = vSign_00;
    local_40 = malloc(__size);
    memset(local_40,0xff,__size);
    __s = malloc(__size);
    memset(__s,0xff,__size);
    iVar1 = 0;
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    local_48 = (ulong)uVar11;
    local_70 = 0;
    for (; iVar1 != (int)local_48; iVar1 = iVar1 + 1) {
      piVar3 = Vec_IntEntryP(vSign_00,iVar1);
      uVar11 = 0;
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        uVar11 = *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                         (ulong)(*(byte *)((long)piVar3 + lVar9) & 0xf) * 4) *
                 (&Vec_IntUniqueHashKey_s_BigPrimes2)[lVar9 * 2] + uVar11 +
                 *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                         (ulong)(*(byte *)((long)piVar3 + lVar9) >> 4) * 4) *
                 (&DAT_007fe274)[lVar9 * 2];
      }
      piVar3 = (int *)((long)local_40 + (long)(int)(uVar11 & local_4c) * 4);
      piVar5 = Vec_IntEntryP(vSign_00,iVar1);
      for (; *piVar3 != -1; piVar3 = (int *)((long)__s + (long)*piVar3 * 4)) {
        piVar6 = Vec_IntEntryP(vSign_00,*piVar3);
        if (*piVar5 == *piVar6) {
          if (*piVar3 != -1) goto LAB_005b36eb;
          break;
        }
      }
      *piVar3 = iVar1;
      local_70 = local_70 + 1;
LAB_005b36eb:
    }
    free(local_40);
    free(__s);
    uVar11 = local_50;
    iVar1 = 0x7fe1f0;
    uVar10 = (ulong)local_70;
    printf("Iter %3d : %6d  out of %6d  ",(ulong)local_50,uVar10,(ulong)(uint)vSign_00->nSize);
    aVar7 = Abc_Clock();
    lVar9 = aVar7 - local_38;
    Abc_Print(iVar1,"%s =","Time");
    Abc_Print(iVar1,"%9.2f sec\n",(double)lVar9 / 1000000.0);
    if (local_70 == local_54) break;
    Gia_Iso3Compute(p,vSign_00);
    Vec_IntFreeP(&vSign);
  }
  Vec_IntFreeP(&vSign);
  return;
}

Assistant:

void Gia_Iso3Test( Gia_Man_t * p )
{
    int nIterMax = 500;
    int i, Prev = -1, This; 
    abctime clk = Abc_Clock();
    Vec_Int_t * vSign = NULL;
    Gia_Iso3Init( p );
    for ( i = 0; i < nIterMax; i++ )
    {
        vSign = Gia_Iso3Save( p );
//        This = Gia_Iso3Unique( vSign );
        This = Vec_IntUniqueCount( vSign, 1, NULL );
        printf( "Iter %3d : %6d  out of %6d  ", i, This, Vec_IntSize(vSign) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( This == Prev )
            break;
        Prev = This;
        Gia_Iso3Compute( p, vSign );
        Vec_IntFreeP( &vSign );
    }
    Vec_IntFreeP( &vSign );
}